

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O1

double * cheby_t_poly_zero(int n)

{
  double *pdVar1;
  ulong uVar2;
  long lVar3;
  double dVar4;
  
  uVar2 = 0xffffffffffffffff;
  if (-1 < n) {
    uVar2 = (long)n * 8;
  }
  pdVar1 = (double *)operator_new__(uVar2);
  if (0 < n) {
    lVar3 = 0;
    do {
      dVar4 = cos(((double)((int)lVar3 + 1) * 3.141592653589793) / (double)(n * 2));
      *(double *)((long)pdVar1 + lVar3 * 4) = dVar4;
      lVar3 = lVar3 + 2;
    } while ((ulong)(uint)n * 2 != lVar3);
  }
  return pdVar1;
}

Assistant:

double *cheby_t_poly_zero ( int n )

//****************************************************************************80
//
//  Purpose:
//
//    CHEBY_T_POLY_ZERO returns zeroes of Chebyshev polynomials T(n,x).
//
//  Discussion:
//
//    The I-th zero of T(N,X) is cos((2*I-1)*PI/(2*N)), I = 1 to N
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    13 May 2014
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the order of the polynomial.
//
//    Output, double CHEBY_T_POLY_ZERO[N], the zeroes of T(N,X).
//
{
  double angle;
  int i;
  const double r8_pi = 3.141592653589793;
  double *z;

  z = new double[n];

  for ( i = 0; i < n; i++ )
  {
    angle = double( 2 * i + 1 ) * r8_pi / double( 2 * n );
    z[i] = cos ( angle );
  }

  return z;
}